

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O1

bool __thiscall bloaty::dwarf::LineInfoReader::ReadLineInfo(LineInfoReader *this)

{
  byte *pbVar1;
  pointer *ppFVar2;
  uint32_t *puVar3;
  bool *pbVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  iterator __position;
  uchar uVar8;
  unsigned_short uVar9;
  int iVar10;
  uint uVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  char *__format;
  bool bVar15;
  string_view data;
  string_view local_78;
  FileName local_68;
  vector<bloaty::dwarf::LineInfoReader::FileName,std::allocator<bloaty::dwarf::LineInfoReader::FileName>>
  *local_40;
  CompilationUnitSizes *local_38;
  
  (this->info_).discriminator = 0;
  (this->info_).end_sequence = false;
  (this->info_).basic_block = false;
  (this->info_).prologue_end = false;
  (this->info_).epilogue_begin = false;
  local_78._M_len = (this->remaining_)._M_len;
  local_78._M_str = (this->remaining_)._M_str;
  bVar15 = local_78._M_len != 0;
  if (bVar15) {
    local_40 = (vector<bloaty::dwarf::LineInfoReader::FileName,std::allocator<bloaty::dwarf::LineInfoReader::FileName>>
                *)&this->filenames_;
    local_38 = &this->sizes_;
    do {
      bVar5 = *local_78._M_str;
      pbVar1 = (byte *)(local_78._M_str + 1);
      uVar13 = local_78._M_len - 1;
      bVar6 = (this->params_).opcode_base;
      if (bVar6 <= bVar5) {
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        Advance(this,(ulong)((byte)(bVar5 - bVar6) / (this->params_).line_range));
        puVar3 = &(this->info_).line;
        *puVar3 = *puVar3 + (uint)((byte)(bVar5 - (this->params_).opcode_base) %
                                  (this->params_).line_range) + (int)(this->params_).line_base;
        uVar13 = local_78._M_len;
        pbVar1 = (byte *)local_78._M_str;
switchD_001b7bf1_caseD_1:
        local_78._M_str = (char *)pbVar1;
        local_78._M_len = uVar13;
        if (this->shadow_ != false) goto LAB_001b7ccd;
        break;
      }
      switch((ulong)bVar5) {
      case 0:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        uVar9 = ReadLEB128<unsigned_short>(&local_78);
        uVar13 = local_78._M_len;
        pbVar1 = (byte *)local_78._M_str;
        if (local_78._M_len == 0) {
LAB_001b7f64:
          local_78._M_str = (char *)pbVar1;
          local_78._M_len = uVar13;
          Throw("premature EOF reading fixed-length data",0x8d);
        }
        bVar5 = *local_78._M_str;
        local_78._M_str = local_78._M_str + 1;
        local_78._M_len = local_78._M_len - 1;
        switch(bVar5) {
        case 1:
          uVar12 = (this->info_).address;
          uVar7 = (this->params_).default_is_stmt;
          (this->info_).address = 0;
          (this->info_).file = 1;
          (this->info_).line = 1;
          (this->info_).column = 0;
          (this->info_).discriminator = 0;
          (this->info_).end_sequence = false;
          (this->info_).basic_block = false;
          (this->info_).prologue_end = false;
          (this->info_).epilogue_begin = false;
          (this->info_).is_stmt = uVar7 != '\0';
          (this->info_).op_index = '\0';
          (this->info_).isa = '\0';
          (this->info_).address = uVar12;
          (this->info_).end_sequence = true;
          uVar13 = local_78._M_len;
          pbVar1 = (byte *)local_78._M_str;
          goto switchD_001b7bf1_caseD_1;
        case 2:
          uVar12 = CompilationUnitSizes::ReadAddress(local_38,&local_78);
          (this->info_).address = uVar12;
          (this->info_).op_index = '\0';
          this->shadow_ = uVar12 == 0;
          break;
        case 3:
          local_68.name = (string_view)ZEXT816(0);
          local_68.name = ReadUntilConsuming(&local_78,'\0');
          local_68.directory_index = ReadLEB128<unsigned_int>(&local_78);
          local_68.modified_time = ReadLEB128Internal(false,&local_78);
          local_68.file_size = ReadLEB128Internal(false,&local_78);
          if ((ulong)((long)(this->include_directories_).
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->include_directories_).
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <=
              (ulong)local_68.directory_index) {
            Throw("directory index out of range",0xd1);
          }
          __position._M_current =
               (this->filenames_).
               super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->filenames_).
              super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<bloaty::dwarf::LineInfoReader::FileName,std::allocator<bloaty::dwarf::LineInfoReader::FileName>>
            ::_M_realloc_insert<bloaty::dwarf::LineInfoReader::FileName_const&>
                      (local_40,__position,&local_68);
          }
          else {
            (__position._M_current)->file_size = local_68.file_size;
            *(ulong *)&(__position._M_current)->directory_index =
                 CONCAT44(local_68._20_4_,local_68.directory_index);
            (__position._M_current)->modified_time = local_68.modified_time;
            ((__position._M_current)->name)._M_len = local_68.name._M_len;
            ((__position._M_current)->name)._M_str = local_68.name._M_str;
            ppFVar2 = &(this->filenames_).
                       super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppFVar2 = *ppFVar2 + 1;
          }
          break;
        case 4:
          uVar11 = ReadLEB128<unsigned_int>(&local_78);
          (this->info_).discriminator = uVar11;
          break;
        default:
          uVar13 = (ulong)uVar9;
          uVar14 = local_78._M_len - uVar13;
          if (local_78._M_len < uVar13) goto LAB_001b7f75;
          local_78._M_str = (char *)((byte *)local_78._M_str + uVar13);
          local_78._M_len = uVar14;
          if (0 < verbose_level) {
            __format = "bloaty: warning: unknown DWARF line table extended opcode: %d\n";
            goto LAB_001b7de9;
          }
        }
        break;
      case 1:
        goto switchD_001b7bf1_caseD_1;
      case 2:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        uVar12 = ReadLEB128Internal(false,&local_78);
        goto LAB_001b7e1d;
      case 3:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        iVar10 = ReadLEB128<int>(&local_78);
        puVar3 = &(this->info_).line;
        *puVar3 = *puVar3 + iVar10;
        break;
      case 4:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        uVar11 = ReadLEB128<unsigned_int>(&local_78);
        (this->info_).file = uVar11;
        uVar13 = ((long)(this->filenames_).
                        super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->filenames_).
                        super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        if (uVar13 < uVar11 || uVar13 - uVar11 == 0) {
          Throw("filename index too big",0xf5);
        }
        break;
      case 5:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        uVar11 = ReadLEB128<unsigned_int>(&local_78);
        (this->info_).column = uVar11;
        break;
      case 6:
        pbVar4 = &(this->info_).is_stmt;
        *pbVar4 = (bool)(*pbVar4 ^ 1);
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        break;
      case 7:
        (this->info_).basic_block = true;
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        break;
      case 8:
        uVar12 = (uint64_t)((byte)~bVar6 / (this->params_).line_range);
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
LAB_001b7e1d:
        Advance(this,uVar12);
        break;
      case 9:
        if (local_78._M_len < 3) goto LAB_001b7f64;
        (this->info_).address = (this->info_).address + (ulong)*(ushort *)(local_78._M_str + 1);
        (this->info_).op_index = '\0';
        local_78._M_len = local_78._M_len - 3;
        local_78._M_str = local_78._M_str + 3;
        break;
      case 10:
        (this->info_).prologue_end = true;
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        break;
      case 0xb:
        (this->info_).epilogue_begin = true;
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        break;
      case 0xc:
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        uVar8 = ReadLEB128<unsigned_char>(&local_78);
        (this->info_).isa = uVar8;
        break;
      default:
        uVar14 = (ulong)(this->standard_opcode_lengths_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[bVar5];
        local_78._M_len = uVar13;
        local_78._M_str = (char *)pbVar1;
        if (uVar13 < uVar14) {
LAB_001b7f75:
          Throw("premature EOF reading variable-length DWARF data",0xad);
        }
        local_78._M_str = (char *)(pbVar1 + uVar14);
        local_78._M_len = uVar13 - uVar14;
        if (0 < verbose_level) {
          __format = "bloaty: warning: unknown DWARF line table opcode: %d\n";
LAB_001b7de9:
          fprintf(_stderr,__format,(ulong)bVar5);
        }
      }
LAB_001b7ccd:
      bVar15 = local_78._M_len != 0;
    } while (bVar15);
  }
  (this->remaining_)._M_len = local_78._M_len;
  (this->remaining_)._M_str = local_78._M_str;
  return bVar15;
}

Assistant:

bool LineInfoReader::ReadLineInfo() {
  // Final step of last DW_LNS_copy / special opcode.
  info_.discriminator = 0;
  info_.basic_block = false;
  info_.prologue_end = false;
  info_.epilogue_begin = false;

  // Final step of DW_LNE_end_sequence.
  info_.end_sequence = false;

  string_view data = remaining_;

  while (true) {
    if (data.empty()) {
      remaining_ = data;
      return false;
    }

    uint8_t op = ReadFixed<uint8_t>(&data);

    if (op >= params_.opcode_base) {
      SpecialOpcodeAdvance(op);
      info_.line +=
          params_.line_base + (AdjustedOpcode(op) % params_.line_range);
      if (!shadow_) {
        remaining_ = data;
        return true;
      }
    } else {
      switch (op) {
        case DW_LNS_extended_op: {
          uint16_t len = ReadLEB128<uint16_t>(&data);
          uint8_t extended_op = ReadFixed<uint8_t>(&data);
          switch (extended_op) {
            case DW_LNE_end_sequence: {
              // Preserve address and set end_sequence, but reset everything
              // else.
              uint64_t addr = info_.address;
              info_ = LineInfo(params_.default_is_stmt);
              info_.address = addr;
              info_.end_sequence = true;
              if (!shadow_) {
                remaining_ = data;
                return true;
              }
              break;
            }
            case DW_LNE_set_address:
              info_.address = sizes_.ReadAddress(&data);
              info_.op_index = 0;
              shadow_ = (info_.address == 0);
              break;
            case DW_LNE_define_file: {
              FileName file_name;
              file_name.name = ReadNullTerminated(&data);
              file_name.directory_index = ReadLEB128<uint32_t>(&data);
              file_name.modified_time = ReadLEB128<uint64_t>(&data);
              file_name.file_size = ReadLEB128<uint64_t>(&data);
              if (file_name.directory_index >= include_directories_.size()) {
                THROW("directory index out of range");
              }
              filenames_.push_back(file_name);
              break;
            }
            case DW_LNE_set_discriminator:
              info_.discriminator = ReadLEB128<uint32_t>(&data);
              break;
            default:
              // We don't understand this opcode, skip it.
              SkipBytes(len, &data);
              if (verbose_level > 0) {
                fprintf(stderr,
                        "bloaty: warning: unknown DWARF line table extended "
                        "opcode: %d\n",
                        extended_op);
              }
              break;
          }
          break;
        }
        case DW_LNS_copy:
          if (!shadow_) {
            remaining_ = data;
            return true;
          }
          break;
        case DW_LNS_advance_pc:
          Advance(ReadLEB128<uint64_t>(&data));
          break;
        case DW_LNS_advance_line:
          info_.line += ReadLEB128<int32_t>(&data);
          break;
        case DW_LNS_set_file:
          info_.file = ReadLEB128<uint32_t>(&data);
          if (info_.file >= filenames_.size()) {
            THROW("filename index too big");
          }
          break;
        case DW_LNS_set_column:
          info_.column = ReadLEB128<uint32_t>(&data);
          break;
        case DW_LNS_negate_stmt:
          info_.is_stmt = !info_.is_stmt;
          break;
        case DW_LNS_set_basic_block:
          info_.basic_block = true;
          break;
        case DW_LNS_const_add_pc:
          SpecialOpcodeAdvance(255);
          break;
        case DW_LNS_fixed_advance_pc:
          info_.address += ReadFixed<uint16_t>(&data);
          info_.op_index = 0;
          break;
        case DW_LNS_set_prologue_end:
          info_.prologue_end = true;
          break;
        case DW_LNS_set_epilogue_begin:
          info_.epilogue_begin = true;
          break;
        case DW_LNS_set_isa:
          info_.isa = ReadLEB128<uint8_t>(&data);
          break;
        default:
          // Unknown opcode, but we know its length so can skip it.
          SkipBytes(standard_opcode_lengths_[op], &data);
          if (verbose_level > 0) {
            fprintf(stderr,
                    "bloaty: warning: unknown DWARF line table opcode: %d\n",
                    op);
          }
          break;
      }
    }
  }
}